

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::iterate
          (TessellationShaderTessellationInputPatchDiscard *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  GLenum GVar5;
  NotSupportedError *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference p_Var7;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  TestError *this_02;
  _tessellation_primitive_mode extraout_EDX;
  _tessellation_primitive_mode primitive_mode;
  uint local_288;
  int local_284;
  uint local_25c;
  MessageBuilder local_258;
  undefined1 local_d8 [8];
  string primitive_mode_string;
  uint n_integer;
  uint n_repetition;
  int expected_primitive_id;
  uint n_primitive_id;
  int *traveller_ptr;
  uint n_expected_repetitions;
  uint n_expected_primitive_ids;
  int expected_primitive_ids [2];
  int *result_data;
  GLenum tf_mode;
  uint n_bytes_needed;
  uint n_bytes_per_result_vertex;
  uint n_vertices_per_patch;
  uint n_total_primitives;
  _run *run;
  __normal_iterator<glcts::TessellationShaderTessellationInputPatchDiscard::_run_*,_std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>_>
  local_60;
  __normal_iterator<const_glcts::TessellationShaderTessellationInputPatchDiscard::_run_*,_std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>_>
  local_58;
  _runs_const_iterator run_iterator;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTessellationInputPatchDiscard *local_10;
  TessellationShaderTessellationInputPatchDiscard *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  run_iterator._M_current = (_run *)CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(run_iterator._M_current + 0x5e))(0x8c89);
  dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
  glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x26e);
  (**(code **)&run_iterator._M_current[0xfd].tc_id)
            ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
  glu::checkError(dVar3,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x272);
  local_60._M_current =
       (_run *)std::
               vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
               ::begin(&this->m_runs);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderTessellationInputPatchDiscard::_run_const*,std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>>>
  ::__normal_iterator<glcts::TessellationShaderTessellationInputPatchDiscard::_run*>
            ((__normal_iterator<glcts::TessellationShaderTessellationInputPatchDiscard::_run_const*,std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>>>
              *)&local_58,&local_60);
  do {
    run = (_run *)std::
                  vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
                  ::end(&this->m_runs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<glcts::TessellationShaderTessellationInputPatchDiscard::_run_*,_std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>_>
                        *)&run);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    p_Var7 = __gnu_cxx::
             __normal_iterator<const_glcts::TessellationShaderTessellationInputPatchDiscard::_run_*,_std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>_>
             ::operator*(&local_58);
    if (p_Var7->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST) {
      local_284 = 2;
    }
    else {
      local_284 = 3;
      if (p_Var7->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) {
        local_284 = 6;
      }
    }
    uVar4 = local_284 * 0x18;
    (**(code **)(run_iterator._M_current + 0x15))(0x8c8e,uVar4,0,0x88e4);
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glBufferData() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x28f);
    (**(code **)(run_iterator._M_current + 0x168))(p_Var7->po_id);
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x293);
    GVar5 = TessellationShaderUtils::getTFModeForPrimitiveMode(p_Var7->primitive_mode,false);
    (**(code **)(run_iterator._M_current + 3))(GVar5);
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glBeginTransformFeedback() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x29a);
    (**(code **)&run_iterator._M_current[0x53].tc_id)
              ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,4);
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x29d);
    (**(code **)&run_iterator._M_current[99].tc_id)();
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x2a0);
    expected_primitive_ids =
         (int  [2])(**(code **)(run_iterator._M_current + 0xd0))(0x8c8e,0,uVar4,3);
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glMapBufferRange() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x2a6);
    _n_expected_repetitions = 0x300000001;
    traveller_ptr._4_4_ = 2;
    if (p_Var7->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST) {
      local_288 = 2;
      primitive_mode = extraout_EDX;
    }
    else {
      primitive_mode = p_Var7->primitive_mode;
      local_288 = 3;
      if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) {
        local_288 = 6;
      }
    }
    traveller_ptr._0_4_ = local_288;
    expected_primitive_id = expected_primitive_ids[0];
    n_primitive_id = expected_primitive_ids[1];
    for (n_repetition = 0; n_repetition < 2; n_repetition = n_repetition + 1) {
      n_integer = (&n_expected_repetitions)[n_repetition];
      for (primitive_mode_string.field_2._12_4_ = 0;
          (uint)primitive_mode_string.field_2._12_4_ < local_288;
          primitive_mode_string.field_2._12_4_ = primitive_mode_string.field_2._12_4_ + 1) {
        for (primitive_mode_string.field_2._8_4_ = 0; (uint)primitive_mode_string.field_2._8_4_ < 3;
            primitive_mode_string.field_2._8_4_ = primitive_mode_string.field_2._8_4_ + 1) {
          if (*(uint *)_expected_primitive_id != n_integer) {
            TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                      ((string *)local_d8,(TessellationShaderUtils *)(ulong)p_Var7->primitive_mode,
                       primitive_mode);
            this_01 = tcu::TestContext::getLog
                                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
            ;
            tcu::TestLog::operator<<(&local_258,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_258,(char (*) [21])"For primitive mode: ");
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_d8);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [34])" invalid gl_PrimitiveID of value ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)_expected_primitive_id);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [32])" was found instead of expected ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&n_integer);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])" at index:");
            local_25c = n_repetition * 3 + primitive_mode_string.field_2._8_4_;
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_25c);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_258);
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,"Discard mechanism failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                       ,0x2d5);
            __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          _expected_primitive_id = (int  [2])((long)_expected_primitive_id + 4);
        }
      }
    }
    memset((void *)expected_primitive_ids,0,(ulong)uVar4);
    (**(code **)(run_iterator._M_current + 0x167))(0x8c8e);
    dVar3 = (**(code **)(run_iterator._M_current + 0x80))();
    glu::checkError(dVar3,"glUnmapBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x2e2);
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderTessellationInputPatchDiscard::_run_*,_std::vector<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>_>
    ::operator++(&local_58,0);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTessellationInputPatchDiscard::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initTest();

	/* We don't need rasterization for this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed.");

	/* Configure amount of vertices per input patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

	/* Iterate through all tests configured */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* Set up XFB target BO storage size. Each input patch will generate:
		 *
		 * a) 1 ivec2 and 1 int IF it is an odd patch;
		 * b) 0 bytes otherwise.
		 *
		 * This gives us a total of 2 * (sizeof(int)*2 + sizeof(int)) = 24 bytes per result coordinate,
		 * assuming it does not get discarded along the way.
		 *
		 * Amount of vertices that TE processes is mode-dependent. Note that for 'quads' we use 6 instead
		 * of 4 because the geometry will be broken down to triangles (1 quad = 2 triangles = 6 vertices)
		 * later in the pipeline.
		 */
		const unsigned int n_total_primitives = 4;
		const unsigned int n_vertices_per_patch =
			((run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES) ?
				 2 :
				 (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) ? 6 : 3);
		const unsigned int n_bytes_per_result_vertex = sizeof(int) + 2 * sizeof(int);
		const unsigned int n_bytes_needed = (n_total_primitives / 2) * n_vertices_per_patch * n_bytes_per_result_vertex;

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL, /* data */
					  GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Activate the program object */
		gl.useProgram(run.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Draw the test geometry. */
		glw::GLenum tf_mode =
			TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, false); /* is_point_mode_enabled */

		gl.beginTransformFeedback(tf_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed.");

		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* vertices per patch */ * n_total_primitives);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the BO with result data into user space */
		int* result_data = (int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
												   n_bytes_needed, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed");

		/* Verification is based on the following reasoning:
		 *
		 * a) Both TC and TE stages should operate on the same primitive IDs (no re-ordering
		 *    of the IDs is allowed)
		 * b) Under test-specific configuration, tessellator will output 2 line segments (4 coordinates).
		 *    Two first two coordinates will be generated during tessellation of the second primitive,
		 *    and the other two coordinates will be generated during tessellation of the fourth primitive
		 *    (out of all four primitives that will enter the pipeline).
		 * c) In case of quads, 6 first coordinates will be generated during tessellation of the second primitive,
		 *    and the other six will be generated during tessellation of the fourth primitive.
		 * d) Finally, tessellator will output 2 triangles (6 coordinates). The first three coordinates will
		 *    be generated during tessellation of the second primitive, and the other two for the fourth
		 *    primitive.
		 * */
		const int expected_primitive_ids[] = {
			1, /* second primitive */
			3  /* fourth primitive */
		};
		const unsigned int n_expected_primitive_ids =
			sizeof(expected_primitive_ids) / sizeof(expected_primitive_ids[0]);
		const unsigned int n_expected_repetitions =
			(run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES) ?
				2 :
				(run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) ? 6 : 3;
		const int* traveller_ptr = result_data;

		for (unsigned int n_primitive_id = 0; n_primitive_id < n_expected_primitive_ids; ++n_primitive_id)
		{
			int expected_primitive_id = expected_primitive_ids[n_primitive_id];

			for (unsigned int n_repetition = 0; n_repetition < n_expected_repetitions; ++n_repetition)
			{
				for (unsigned int n_integer = 0; n_integer < 3 /* ivec2 + int */; ++n_integer)
				{
					if (*traveller_ptr != expected_primitive_id)
					{
						std::string primitive_mode_string =
							TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);

						m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: " << primitive_mode_string
										   << " invalid gl_PrimitiveID of value " << *traveller_ptr
										   << " was found instead of expected " << expected_primitive_id
										   << " at index:" << n_primitive_id * 3 /* ivec2 + int */ + n_integer
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Discard mechanism failed");
					}

					traveller_ptr++;
				} /* for (all captured integers) */
			}	 /* for (all repetitions) */
		}		  /* for (all non-discarded primitive ids) */

		/* Clear the buffer storage space before we unmap it */
		memset(result_data, 0, n_bytes_needed);

		/* Unmap the BO */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}